

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1c_vector_op.cpp
# Opt level: O2

int main(void)

{
  pointer piVar1;
  ostream *poVar2;
  vector<int,_std::allocator<int>_> *__range1;
  int *piVar3;
  bool bVar4;
  vector<int,_std::allocator<int>_> v;
  int x;
  int round;
  string s;
  _Vector_base<int,_std::allocator<int>_> local_78;
  int local_58;
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::istream::operator>>((istream *)&std::cin,&local_54);
  local_78._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    piVar1 = local_78._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = local_54 == 0;
    local_54 = local_54 + -1;
    piVar3 = local_78._M_impl.super__Vector_impl_data._M_start;
    if (bVar4) {
      for (; piVar3 != piVar1; piVar3 = piVar3 + 1) {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
        std::operator<<(poVar2," ");
      }
      std::operator<<((ostream *)&std::cout,"\n");
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
      return 0;
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::operator>>((istream *)&std::cin,(string *)&local_50);
    bVar4 = std::operator==(&local_50,"pb");
    if (bVar4) {
      std::istream::operator>>((istream *)&std::cin,&local_58);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_78,&local_58);
    }
    else {
      bVar4 = std::operator==(&local_50,"sa");
      if (bVar4) {
        std::
        __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_78._M_impl.super__Vector_impl_data._M_start,
                   local_78._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        bVar4 = std::operator==(&local_50,"sd");
        if (bVar4) {
          std::
          __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_78._M_impl.super__Vector_impl_data._M_start,
                     local_78._M_impl.super__Vector_impl_data._M_finish);
        }
        else {
          bVar4 = std::operator==(&local_50,"r");
          if (!bVar4) {
            bVar4 = std::operator==(&local_50,"d");
            if (bVar4) {
              std::istream::operator>>((istream *)&std::cin,&local_58);
              piVar3 = local_78._M_impl.super__Vector_impl_data._M_start + (long)local_58 + 1;
              if (piVar3 != local_78._M_impl.super__Vector_impl_data._M_finish) {
                memmove(local_78._M_impl.super__Vector_impl_data._M_start + local_58,piVar3,
                        (long)local_78._M_impl.super__Vector_impl_data._M_finish - (long)piVar3);
              }
              local_78._M_impl.super__Vector_impl_data._M_finish =
                   local_78._M_impl.super__Vector_impl_data._M_finish + -1;
            }
            goto LAB_00101396;
          }
        }
        reverse((vector<int,_std::allocator<int>_> *)&local_78);
      }
    }
LAB_00101396:
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

int main() {
    int round;
    cin >> round;
    vector<int> v;
    while (round--) {
        string s;
        cin >> s;

        if (s == "pb") {
            int x;
            cin >> x;
            v.push_back(x);
        } else if (s == "sa") {
            sort(v.begin(), v.end());
        } else if (s == "sd") {
            sort(v.begin(), v.end());
            reverse(v);
        } else if (s == "r") {
            reverse(v);
        } else if (s == "d") {
            int i;
            cin >> i;
            v.erase(v.begin() + i);
        }
    }
    for (auto e : v) {
        cout << e << " ";
    }
    cout << "\n";
}